

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGhsMultiGenerator::WriteProjectLine
          (cmGlobalGhsMultiGenerator *this,ostream *fout,cmGeneratorTarget *target,
          string *rootBinaryDir)

{
  cmValue remote;
  cmValue cVar1;
  ostream *poVar2;
  allocator<char> local_49;
  string path;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,"GENERATOR_FILE_NAME",&local_49);
  remote = cmGeneratorTarget::GetProperty(target,&path);
  std::__cxx11::string::~string((string *)&path);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&path,"GENERATOR_FILE_NAME_EXT",&local_49);
  cVar1 = cmGeneratorTarget::GetProperty(target,&path);
  std::__cxx11::string::~string((string *)&path);
  if (cVar1.Value != (string *)0x0 && remote.Value != (string *)0x0) {
    cmSystemTools::RelativePath(&path,rootBinaryDir,remote.Value);
    std::operator<<(fout,(string *)&path);
    poVar2 = std::operator<<(fout,' ');
    poVar2 = std::operator<<(poVar2,(string *)cVar1.Value);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&path);
  }
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteProjectLine(
  std::ostream& fout, cmGeneratorTarget const* target,
  std::string& rootBinaryDir)
{
  cmValue projFile = target->GetProperty("GENERATOR_FILE_NAME");
  cmValue projType = target->GetProperty("GENERATOR_FILE_NAME_EXT");
  /* If either value is not valid then this particular target is an
   * unsupported target type and should be skipped.
   */
  if (projFile && projType) {
    std::string path = cmSystemTools::RelativePath(rootBinaryDir, projFile);

    fout << path;
    fout << ' ' << *projType << '\n';
  }
}